

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264e_vepu580.c
# Opt level: O2

MPP_RET hal_h264e_vepu580_start(void *hal,HalEncTask *task)

{
  void *pvVar1;
  MPP_RET MVar2;
  MPP_RET MVar3;
  char *fmt;
  ulong uVar4;
  MppDevRegWrCfg wr_cfg;
  MppDevRegRdCfg rd_cfg;
  
  pvVar1 = *(void **)((long)hal + 0x1d0);
  if (((byte)hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu580","enter %p\n","hal_h264e_vepu580_start",hal);
  }
  wr_cfg.size = 0x60;
  wr_cfg.offset = 0;
  wr_cfg.reg = pvVar1;
  MVar2 = mpp_dev_ioctl(*(MppDev *)((long)hal + 8),4,&wr_cfg);
  if (MVar2 == MPP_OK) {
    wr_cfg.reg = (void *)((long)pvVar1 + 0x60);
    wr_cfg.size = 0x178;
    wr_cfg.offset = 0x280;
    MVar2 = mpp_dev_ioctl(*(MppDev *)((long)hal + 8),4,&wr_cfg);
    if (MVar2 != MPP_OK) goto LAB_00217176;
    wr_cfg.reg = (void *)((long)pvVar1 + 0x1d8);
    wr_cfg.size = 0xe4;
    wr_cfg.offset = 0x1000;
    MVar2 = mpp_dev_ioctl(*(MppDev *)((long)hal + 8),4,&wr_cfg);
    if (MVar2 != MPP_OK) goto LAB_00217176;
    wr_cfg.reg = (void *)((long)pvVar1 + 700);
    wr_cfg.size = 0x2d0;
    wr_cfg.offset = 0x1700;
    MVar2 = mpp_dev_ioctl(*(MppDev *)((long)hal + 8),4,&wr_cfg);
    if (MVar2 != MPP_OK) goto LAB_00217176;
    wr_cfg.reg = (void *)((long)pvVar1 + 0x58c);
    wr_cfg.size = 0x1e8;
    wr_cfg.offset = 0x2000;
    MVar2 = mpp_dev_ioctl(*(MppDev *)((long)hal + 8),4,&wr_cfg);
    if (MVar2 != MPP_OK) goto LAB_00217176;
    wr_cfg.reg = (void *)((long)pvVar1 + 0x774);
    wr_cfg.size = 0xa9c;
    wr_cfg.offset = 0x2200;
    MVar2 = mpp_dev_ioctl(*(MppDev *)((long)hal + 8),4,&wr_cfg);
    if (MVar2 != MPP_OK) goto LAB_00217176;
    wr_cfg.reg = (void *)((long)pvVar1 + 0x1210);
    wr_cfg.size = 0x480;
    wr_cfg.offset = 0x3000;
    MVar2 = mpp_dev_ioctl(*(MppDev *)((long)hal + 8),4,&wr_cfg);
    if (MVar2 != MPP_OK) goto LAB_00217176;
    MVar2 = mpp_dev_ioctl(*(MppDev *)((long)hal + 8),7,*(void **)((long)hal + 0x38));
    if (MVar2 == MPP_OK) {
      rd_cfg.reg = (void *)((long)pvVar1 + 0x2c);
      rd_cfg.size = 4;
      rd_cfg.offset = 0x2c;
      MVar2 = mpp_dev_ioctl(*(MppDev *)((long)hal + 8),5,&rd_cfg);
      if (MVar2 == MPP_OK) {
        rd_cfg.reg = (void *)((long)pvVar1 + 0x1690);
        rd_cfg.size = 0x2d0;
        rd_cfg.offset = 0x4000;
        MVar2 = mpp_dev_ioctl(*(MppDev *)((long)hal + 8),5,&rd_cfg);
        if (MVar2 == MPP_OK) {
          MVar3 = mpp_dev_ioctl(*(MppDev *)((long)hal + 8),0xf,(void *)0x0);
          MVar2 = MPP_OK;
          if (MVar3 != MPP_OK) {
            _mpp_log_l(2,"hal_h264e_vepu580","send cmd failed %d\n","hal_h264e_vepu580_start",
                       (ulong)(uint)MVar3);
            MVar2 = MVar3;
          }
          goto LAB_0021719b;
        }
      }
      uVar4 = (ulong)(uint)MVar2;
      fmt = "set register read failed %d\n";
    }
    else {
      uVar4 = (ulong)(uint)MVar2;
      fmt = "set register offsets failed %d\n";
    }
  }
  else {
LAB_00217176:
    uVar4 = (ulong)(uint)MVar2;
    fmt = "set register write failed %d\n";
  }
  _mpp_log_l(2,"hal_h264e_vepu580",fmt,"hal_h264e_vepu580_start",uVar4);
  MVar2 = (MPP_RET)uVar4;
LAB_0021719b:
  if (((byte)hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu580","leave %p\n","hal_h264e_vepu580_start",hal);
  }
  return MVar2;
}

Assistant:

static MPP_RET hal_h264e_vepu580_start(void *hal, HalEncTask *task)
{
    MPP_RET ret = MPP_OK;
    HalH264eVepu580Ctx *ctx = (HalH264eVepu580Ctx *)hal;
    HalVepu580RegSet *regs = ctx->regs_set;

    (void) task;

    hal_h264e_dbg_func("enter %p\n", hal);

    do {
        MppDevRegWrCfg wr_cfg;
        MppDevRegRdCfg rd_cfg;

        wr_cfg.reg = &regs->reg_ctl;
        wr_cfg.size = sizeof(regs->reg_ctl);
        wr_cfg.offset = VEPU580_CONTROL_CFG_OFFSET;
#if DUMP_REG
        {
            RK_U32 i;
            RK_U32 *reg = (RK_U32)wr_cfg.reg;
            for ( i = 0; i < sizeof(regs->reg_ctl) / sizeof(RK_U32); i++) {
                /* code */
                mpp_log("reg[%d] = 0x%08x\n", i, reg[i]);
            }

        }
#endif
        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }
        wr_cfg.reg = &regs->reg_base;
        wr_cfg.size = sizeof(regs->reg_base);
        wr_cfg.offset = VEPU580_BASE_CFG_OFFSET;

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }
        wr_cfg.reg = &regs->reg_rc_klut;
        wr_cfg.size = sizeof(regs->reg_rc_klut);
        wr_cfg.offset = VEPU580_RC_KLUT_CFG_OFFSET;

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }
        wr_cfg.reg = &regs->reg_s3;
        wr_cfg.size = sizeof(regs->reg_s3);
        wr_cfg.offset = VEPU580_SECTION_3_OFFSET;

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }
        wr_cfg.reg = &regs->reg_rdo;
        wr_cfg.size = sizeof(regs->reg_rdo);
        wr_cfg.offset = VEPU580_RDO_CFG_OFFSET;

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        wr_cfg.reg = &regs->reg_scl;
        wr_cfg.size = sizeof(regs->reg_scl);
        wr_cfg.offset = VEPU580_SCL_CFG_OFFSET;

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        wr_cfg.reg = &regs->reg_osd;
        wr_cfg.size = sizeof(regs->reg_osd);
        wr_cfg.offset = VEPU580_OSD_OFFSET;

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_OFFS, ctx->offsets);
        if (ret) {
            mpp_err_f("set register offsets failed %d\n", ret);
            break;
        }

        rd_cfg.reg = &regs->reg_ctl.int_sta;
        rd_cfg.size = sizeof(RK_U32);
        rd_cfg.offset = VEPU580_REG_BASE_HW_STATUS;

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_RD, &rd_cfg);
        if (ret) {
            mpp_err_f("set register read failed %d\n", ret);
            break;
        }

        rd_cfg.reg = &regs->reg_st;
        rd_cfg.size = sizeof(regs->reg_st);
        rd_cfg.offset = VEPU580_STATUS_OFFSET;

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_RD, &rd_cfg);
        if (ret) {
            mpp_err_f("set register read failed %d\n", ret);
            break;
        }

        /* send request to hardware */
        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_CMD_SEND, NULL);
        if (ret) {
            mpp_err_f("send cmd failed %d\n", ret);
            break;
        }
    } while (0);

    hal_h264e_dbg_func("leave %p\n", hal);

    return ret;
}